

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerup::EndEffect(APowerup *this)

{
  uint uVar1;
  AActor *pAVar2;
  TObjPtr<AActor> *obj;
  
  uVar1 = (this->BlendColor).field_0.d;
  if ((uVar1 & 0xffff0000) == 0xb60000) {
    obj = &(this->super_AInventory).Owner;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar2 != (AActor *)0x0) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (pAVar2->player != (player_t *)0x0) {
        pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
        if ((uVar1 & 0xffff) == (int)pAVar2->player->fixedcolormap) {
          pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
          pAVar2->player->fixedcolormap = -1;
        }
      }
    }
  }
  return;
}

Assistant:

void APowerup::Tick ()
{
	// Powerups cannot exist outside an inventory
	if (Owner == NULL)
	{
		Destroy ();
	}
	if (EffectTics > 0 && --EffectTics == 0)
	{
		Destroy ();
	}
}